

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O2

bool __thiscall CConsole::ExecuteFile(CConsole *this,char *pFilename)

{
  CExecFile **ppCVar1;
  char cVar2;
  long lVar3;
  CExecFile *pCVar4;
  IStorage *pIVar5;
  int iVar6;
  IOHANDLE IoHandle;
  char *pcVar7;
  bool bVar8;
  CExecFile **ppCVar9;
  long in_FS_OFFSET;
  CExecFile ThisFile;
  CLineReader LineReader;
  char aBuf [256];
  undefined4 extraout_var;
  
  LineReader.m_aBuffer[0x120] = '\0';
  LineReader.m_aBuffer[0x121] = '\0';
  LineReader.m_aBuffer[0x122] = '\0';
  LineReader.m_aBuffer[0x123] = '\0';
  LineReader.m_aBuffer[0x124] = '\0';
  LineReader.m_aBuffer[0x125] = '\0';
  LineReader.m_aBuffer[0x126] = '\0';
  LineReader.m_aBuffer[0x127] = '\0';
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  ppCVar1 = &this->m_pFirstExec;
  ppCVar9 = ppCVar1;
  do {
    pCVar4 = *ppCVar9;
    if (pCVar4 == (CExecFile *)0x0) {
      pIVar5 = this->m_pStorage;
      if (pIVar5 != (IStorage *)0x0) {
        pCVar4 = *ppCVar1;
        *ppCVar1 = &ThisFile;
        ThisFile.m_pFilename = pFilename;
        ThisFile.m_pPrev = pCVar4;
        iVar6 = (*(pIVar5->super_IInterface)._vptr_IInterface[4])
                          (pIVar5,pFilename,9,0xffffffffffffffff,0,0,0,0);
        IoHandle = (IOHANDLE)CONCAT44(extraout_var,iVar6);
        bVar8 = IoHandle != (IOHANDLE)0x0;
        if (IoHandle == (IOHANDLE)0x0) {
          str_format(aBuf,0x100,"failed to open \'%s\'",pFilename);
          (*(this->super_IConsole).super_IInterface._vptr_IInterface[0x19])(this,0,"console",aBuf,0)
          ;
          cVar2 = *pFilename;
          if ((cVar2 != '\0') &&
             (((cVar2 == '/' || (cVar2 == '\\')) ||
              ((pFilename[1] == ':' && ((pFilename[2] == '\\' || (pFilename[2] == '/')))))))) {
            (*(this->super_IConsole).super_IInterface._vptr_IInterface[0x19])
                      (this,0,"console",
                       "Info: only relative paths starting from the ones you specify in \'storage.cfg\' are allowed"
                       ,0);
          }
        }
        else {
          str_format(aBuf,0x100,"executing \'%s\'",pFilename);
          (*(this->super_IConsole).super_IInterface._vptr_IInterface[0x19])(this,0,"console",aBuf,0)
          ;
          CLineReader::Init(&LineReader,IoHandle);
          while (pcVar7 = CLineReader::Get(&LineReader), pcVar7 != (char *)0x0) {
            (*(this->super_IConsole).super_IInterface._vptr_IInterface[0x13])(this,pcVar7);
          }
          io_close(IoHandle);
        }
        *ppCVar1 = pCVar4;
        goto LAB_001242a5;
      }
      break;
    }
    iVar6 = str_comp(pFilename,pCVar4->m_pFilename);
    ppCVar9 = &pCVar4->m_pPrev;
  } while (iVar6 != 0);
  bVar8 = false;
LAB_001242a5:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar3) {
    __stack_chk_fail();
  }
  return bVar8;
}

Assistant:

bool CConsole::ExecuteFile(const char *pFilename)
{
	// make sure that this isn't being executed already
	for(CExecFile *pCur = m_pFirstExec; pCur; pCur = pCur->m_pPrev)
		if(str_comp(pFilename, pCur->m_pFilename) == 0)
			return false;

	if(!m_pStorage)
		return false;

	// push this one to the stack
	CExecFile ThisFile;
	CExecFile *pPrev = m_pFirstExec;
	ThisFile.m_pFilename = pFilename;
	ThisFile.m_pPrev = m_pFirstExec;
	m_pFirstExec = &ThisFile;

	// exec the file
	IOHANDLE File = m_pStorage->OpenFile(pFilename, IOFLAG_READ | IOFLAG_SKIP_BOM, IStorage::TYPE_ALL);

	char aBuf[256];
	if(File)
	{
		str_format(aBuf, sizeof(aBuf), "executing '%s'", pFilename);
		Print(IConsole::OUTPUT_LEVEL_STANDARD, "console", aBuf);

		CLineReader LineReader;
		LineReader.Init(File);
		const char *pLine;
		while((pLine = LineReader.Get()))
			ExecuteLine(pLine);

		io_close(File);
	}
	else
	{
		str_format(aBuf, sizeof(aBuf), "failed to open '%s'", pFilename);
		Print(IConsole::OUTPUT_LEVEL_STANDARD, "console", aBuf);
		bool AbsHeur = false;
		AbsHeur = AbsHeur || (pFilename[0] == '/' || pFilename[0] == '\\');
		AbsHeur = AbsHeur || (pFilename[0] && pFilename[1] == ':' && (pFilename[2] == '/' || pFilename[2] == '\\'));
		if(AbsHeur)
		{
			Print(IConsole::OUTPUT_LEVEL_STANDARD, "console", "Info: only relative paths starting from the ones you specify in 'storage.cfg' are allowed");
		}
	}

	m_pFirstExec = pPrev;
	return (bool)File;
}